

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O2

void __thiscall OpenMD::COHZ::postCorrelate(COHZ *this)

{
  int in_EDX;
  int extraout_EDX;
  int in_ESI;
  long lVar1;
  uint j;
  ulong uVar2;
  uint i;
  ulong uVar3;
  
  for (uVar3 = 0;
      uVar3 < (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
              super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
              super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.nTimeBins_; uVar3 = uVar3 + 1) {
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < this->nZBins_; uVar2 = uVar2 + 1) {
      if (0 < *(int *)(*(long *)&(this->counts_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + uVar2 * 4)) {
        Vector<double,_4U>::div
                  ((Vector<double,_4U> *)
                   (*(long *)&(this->histogram_).
                              super__Vector_base<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar3].
                              super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                              ._M_impl.super__Vector_impl_data + lVar1),in_ESI,in_EDX);
        in_EDX = extraout_EDX;
      }
      lVar1 = lVar1 + 0x20;
    }
  }
  return;
}

Assistant:

void COHZ::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      for (unsigned int j = 0; j < nZBins_; ++j) {
        if (counts_[i][j] > 0) { histogram_[i][j] /= counts_[i][j]; }
      }
    }
  }